

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
r_code::list<core::P<r_exec::Overlay>_>::push_back_new_cell
          (list<core::P<r_exec::Overlay>_> *this,P<r_exec::Overlay> *t)

{
  cell c;
  
  c.next = -1;
  c.prev = -1;
  c.data.object = (_Object *)0x0;
  core::P<r_exec::Overlay>::operator=(&c.data,t);
  c.next = -1;
  c.prev = this->used_cells_tail;
  std::
  vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
  ::push_back(&this->cells,&c);
  this->used_cells_tail =
       ((long)(this->cells).
              super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18 + -1;
  core::P<r_exec::Overlay>::~P(&c.data);
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }